

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

ClientRequest * __thiscall
cmFileAPI::BuildClientRequest(ClientRequest *__return_storage_ptr__,cmFileAPI *this,Value *request)

{
  string *error;
  pointer *ppRVar1;
  bool bVar2;
  int iVar3;
  ObjectKind OVar4;
  Value *this_00;
  long *plVar5;
  cmFileAPI *this_01;
  char *pcVar6;
  pointer pRVar7;
  ulong uVar8;
  vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> versions;
  vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> local_88;
  long lStack_70;
  string local_68;
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  (__return_storage_ptr__->super_Object).Version = 0;
  error = &__return_storage_ptr__->Error;
  (__return_storage_ptr__->Error)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Error).field_2;
  (__return_storage_ptr__->Error)._M_string_length = 0;
  (__return_storage_ptr__->Error).field_2._M_local_buf[0] = '\0';
  bVar2 = Json::Value::isObject(request);
  if (!bVar2) {
    std::__cxx11::string::_M_replace
              ((ulong)error,0,(char *)(__return_storage_ptr__->Error)._M_string_length,0x4fddc3);
    return __return_storage_ptr__;
  }
  this_00 = Json::Value::operator[](request,"kind");
  bVar2 = Json::Value::isNull(this_00);
  if (bVar2) {
    pcVar6 = "\'kind\' member missing";
LAB_00268228:
    std::__cxx11::string::_M_replace
              ((ulong)error,0,(char *)(__return_storage_ptr__->Error)._M_string_length,(ulong)pcVar6
              );
    return __return_storage_ptr__;
  }
  bVar2 = Json::Value::isString(this_00);
  if (!bVar2) {
    pcVar6 = "\'kind\' member is not a string";
    goto LAB_00268228;
  }
  Json::Value::asString_abi_cxx11_(&local_68,this_00);
  iVar3 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar3 == 0) {
    OVar4 = CodeModel;
LAB_0026825e:
    (__return_storage_ptr__->super_Object).Kind = OVar4;
    this_01 = (cmFileAPI *)Json::Value::operator[](request,"version");
    bVar2 = Json::Value::isNull((Value *)this_01);
    if (bVar2) {
      std::__cxx11::string::_M_replace
                ((ulong)error,0,(char *)(__return_storage_ptr__->Error)._M_string_length,0x4fde27);
      goto LAB_00268382;
    }
    local_88.
    super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = ReadRequestVersions((Value *)this_01,&local_88,error);
    if (bVar2) {
      switch((__return_storage_ptr__->super_Object).Kind) {
      case CodeModel:
        BuildClientRequestCodeModel(this_01,__return_storage_ptr__,&local_88);
        break;
      case Cache:
        BuildClientRequestCache(this_01,__return_storage_ptr__,&local_88);
        break;
      case CMakeFiles:
        BuildClientRequestCMakeFiles(this_01,__return_storage_ptr__,&local_88);
        break;
      case InternalTest:
        BuildClientRequestInternalTest(this_01,__return_storage_ptr__,&local_88);
      }
    }
    if (local_88.
        super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00268382;
    uVar8 = (long)local_88.
                  super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
            (long)local_88.
                  super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_48._0_8_ =
         local_88.
         super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar3 == 0) {
      OVar4 = Cache;
      goto LAB_0026825e;
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar3 == 0) {
      OVar4 = CMakeFiles;
      goto LAB_0026825e;
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar3 == 0) {
      OVar4 = InternalTest;
      goto LAB_0026825e;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   "unknown request kind \'",&local_68);
    plVar5 = (long *)std::__cxx11::string::append(local_48);
    ppRVar1 = &local_88.
               super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pRVar7 = (pointer)(plVar5 + 2);
    if ((pointer)*plVar5 == pRVar7) {
      local_88.
      super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pRVar7;
      lStack_70 = plVar5[3];
      local_88.
      super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)ppRVar1;
    }
    else {
      local_88.
      super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pRVar7;
      local_88.
      super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar5;
    }
    local_88.
    super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar5[1];
    *plVar5 = (long)pRVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)error,(string *)&local_88);
    if (local_88.
        super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)ppRVar1) {
      operator_delete(local_88.
                      super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    if ((pointer)local_48._0_8_ == (pointer)(local_48 + 0x10)) goto LAB_00268382;
    uVar8 = local_38._M_allocated_capacity + 1;
  }
  operator_delete((void *)local_48._0_8_,uVar8);
LAB_00268382:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    return __return_storage_ptr__;
  }
  operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

cmFileAPI::ClientRequest cmFileAPI::BuildClientRequest(
  Json::Value const& request)
{
  ClientRequest r;

  if (!request.isObject()) {
    r.Error = "request is not an object";
    return r;
  }

  Json::Value const& kind = request["kind"];
  if (kind.isNull()) {
    r.Error = "'kind' member missing";
    return r;
  }
  if (!kind.isString()) {
    r.Error = "'kind' member is not a string";
    return r;
  }
  std::string const& kindName = kind.asString();

  if (kindName == this->ObjectKindName(ObjectKind::CodeModel)) {
    r.Kind = ObjectKind::CodeModel;
  } else if (kindName == this->ObjectKindName(ObjectKind::Cache)) {
    r.Kind = ObjectKind::Cache;
  } else if (kindName == this->ObjectKindName(ObjectKind::CMakeFiles)) {
    r.Kind = ObjectKind::CMakeFiles;
  } else if (kindName == this->ObjectKindName(ObjectKind::InternalTest)) {
    r.Kind = ObjectKind::InternalTest;
  } else {
    r.Error = "unknown request kind '" + kindName + "'";
    return r;
  }

  Json::Value const& version = request["version"];
  if (version.isNull()) {
    r.Error = "'version' member missing";
    return r;
  }
  std::vector<RequestVersion> versions;
  if (!cmFileAPI::ReadRequestVersions(version, versions, r.Error)) {
    return r;
  }

  switch (r.Kind) {
    case ObjectKind::CodeModel:
      this->BuildClientRequestCodeModel(r, versions);
      break;
    case ObjectKind::Cache:
      this->BuildClientRequestCache(r, versions);
      break;
    case ObjectKind::CMakeFiles:
      this->BuildClientRequestCMakeFiles(r, versions);
      break;
    case ObjectKind::InternalTest:
      this->BuildClientRequestInternalTest(r, versions);
      break;
  }

  return r;
}